

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_handle_populate(void *handle_dest,void *handle_src)

{
  int iVar1;
  vector pvVar2;
  void *in_RSI;
  void *in_RDI;
  char *duplicated_key;
  context ctx_src;
  context ctx_dest;
  long local_30;
  context local_28;
  context local_20;
  void *local_18;
  undefined1 local_10 [12];
  int local_4;
  
  local_18 = in_RSI;
  local_20 = loader_impl_handle_context(in_RDI);
  local_28 = loader_impl_handle_context(local_18);
  iVar1 = context_contains(local_28,local_20,&local_30);
  if ((iVar1 == 0) && (local_30 != 0)) {
    log_write_impl_va("metacall",0x26d,"loader_handle_populate",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,3,"Duplicated symbol found named \'%s\' already defined in the handle scope",
                      local_30);
    local_4 = 1;
  }
  else {
    iVar1 = context_append(local_20,local_28);
    if (iVar1 == 0) {
      pvVar2 = loader_impl_handle_populated(local_18);
      vector_push_back(pvVar2,local_10);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int loader_handle_populate(void *handle_dest, void *handle_src)
{
	context ctx_dest = loader_impl_handle_context(handle_dest);
	context ctx_src = loader_impl_handle_context(handle_src);
	char *duplicated_key;

	if (context_contains(ctx_src, ctx_dest, &duplicated_key) == 0 && duplicated_key != NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the handle scope", duplicated_key);
		return 1;
	}
	else if (context_append(ctx_dest, ctx_src) == 0)
	{
		vector_push_back_var(loader_impl_handle_populated(handle_src), handle_dest);

		return 0;
	}

	return 1;
}